

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cameras.cpp
# Opt level: O0

void __thiscall
pbrt::RealisticCamera::ComputeThickLensApproximation(RealisticCamera *this,Float *pz,Float *fz)

{
  Vector3f d;
  Vector3f d_00;
  RealisticCamera *in_RDI;
  Float FVar1;
  Ray *in_stack_00000028;
  Ray *in_stack_00000030;
  RealisticCamera *in_stack_00000038;
  Ray *in_stack_00000040;
  RealisticCamera *in_stack_00000048;
  Ray rFilm;
  Ray rScene;
  Float x;
  nullptr_t in_stack_fffffffffffffe18;
  Ray *pRVar2;
  Ray *in_stack_fffffffffffffe20;
  Ray *this_00;
  float fVar3;
  char *in_stack_fffffffffffffe50;
  Tuple3<pbrt::Point3,_float> in_stack_fffffffffffffe58;
  Float *in_stack_fffffffffffffe88;
  Float *in_stack_fffffffffffffe90;
  Ray *in_stack_fffffffffffffe98;
  undefined4 in_stack_fffffffffffffea0;
  undefined4 in_stack_fffffffffffffea4;
  Ray *local_140;
  undefined4 local_138;
  Ray local_100;
  Ray local_d8 [2];
  undefined8 local_88;
  undefined4 local_80;
  undefined8 local_78;
  undefined4 local_70;
  undefined8 local_60;
  undefined4 local_58;
  undefined8 local_54;
  undefined4 local_4c;
  float local_1c;
  
  FVar1 = Film::Diagonal((Film *)in_stack_fffffffffffffe20);
  local_1c = FVar1 * 0.001;
  LensFrontZ(in_RDI);
  fVar3 = 0.0;
  Point3<float>::Point3
            (&in_stack_fffffffffffffe20->o,(float)((ulong)in_stack_fffffffffffffe18 >> 0x20),
             SUB84(in_stack_fffffffffffffe18,0),0.0);
  Vector3<float>::Vector3
            ((Vector3<float> *)in_stack_fffffffffffffe20,
             (float)((ulong)in_stack_fffffffffffffe18 >> 0x20),SUB84(in_stack_fffffffffffffe18,0),
             0.0);
  Medium::TaggedPointer((Medium *)in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
  local_70 = local_4c;
  local_78 = local_54;
  local_80 = local_58;
  local_88 = local_60;
  d.super_Tuple3<pbrt::Vector3,_float>._4_8_ = in_RDI;
  d.super_Tuple3<pbrt::Vector3,_float>.x = fVar3;
  Ray::Ray(in_stack_fffffffffffffe20,(Point3f)in_stack_fffffffffffffe58,d,
           (Float)((ulong)in_stack_fffffffffffffe18 >> 0x20),(Medium *)0x8b1e1c);
  Ray::Ray(in_stack_fffffffffffffe20);
  FVar1 = TraceLensesFromScene(in_stack_00000048,in_stack_00000040,(Ray *)in_stack_00000038);
  if ((FVar1 == 0.0) && (!NAN(FVar1))) {
    ErrorExit<>(in_stack_fffffffffffffe50);
  }
  pRVar2 = local_d8;
  Ray::Ray(in_stack_fffffffffffffe20,pRVar2);
  this_00 = &local_100;
  Ray::Ray(this_00,pRVar2);
  ComputeCardinalPoints
            ((Ray *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
             in_stack_fffffffffffffe98,in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
  LensRearZ((RealisticCamera *)0x8b1ec5);
  Point3<float>::Point3(&this_00->o,(float)((ulong)pRVar2 >> 0x20),SUB84(pRVar2,0),0.0);
  Vector3<float>::Vector3
            ((Vector3<float> *)this_00,(float)((ulong)pRVar2 >> 0x20),SUB84(pRVar2,0),0.0);
  Medium::TaggedPointer((Medium *)this_00,pRVar2);
  d_00.super_Tuple3<pbrt::Vector3,_float>._4_8_ = in_RDI;
  d_00.super_Tuple3<pbrt::Vector3,_float>.x = fVar3;
  Ray::Ray(this_00,(Point3f)in_stack_fffffffffffffe58,d_00,(Float)((ulong)pRVar2 >> 0x20),
           (Medium *)0x8b1f9f);
  Ray::operator=(this_00,pRVar2);
  FVar1 = TraceLensesFromFilm(in_stack_00000038,in_stack_00000030,in_stack_00000028);
  if ((FVar1 == 0.0) && (!NAN(FVar1))) {
    ErrorExit<>(in_stack_fffffffffffffe50);
  }
  Ray::Ray(this_00,pRVar2);
  Ray::Ray(this_00,pRVar2);
  ComputeCardinalPoints
            ((Ray *)CONCAT44(in_stack_fffffffffffffea4,local_138),local_140,
             in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
  return;
}

Assistant:

void RealisticCamera::ComputeThickLensApproximation(Float pz[2], Float fz[2]) const {
    // Find height $x$ from optical axis for parallel rays
    Float x = .001f * film.Diagonal();

    // Compute cardinal points for film side of lens system
    Ray rScene(Point3f(x, 0, LensFrontZ() + 1), Vector3f(0, 0, -1));
    Ray rFilm;
    if (!TraceLensesFromScene(rScene, &rFilm))
        ErrorExit("Unable to trace ray from scene to film for thick lens "
                  "approximation. Is aperture stop extremely small?");
    ComputeCardinalPoints(rScene, rFilm, &pz[0], &fz[0]);

    // Compute cardinal points for scene side of lens system
    rFilm = Ray(Point3f(x, 0, LensRearZ() - 1), Vector3f(0, 0, 1));
    if (TraceLensesFromFilm(rFilm, &rScene) == 0)
        ErrorExit("Unable to trace ray from film to scene for thick lens "
                  "approximation. Is aperture stop extremely small?");
    ComputeCardinalPoints(rFilm, rScene, &pz[1], &fz[1]);
}